

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall TestSuite::TestSuite(TestSuite *this,int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long in_RDX;
  int in_ESI;
  TestOptions *in_RDI;
  int ii;
  TestOptions *this_00;
  int local_28;
  
  TestOptions::TestOptions(in_RDI);
  *(undefined8 *)&in_RDI[2].preserveTestFiles = 0;
  *(undefined8 *)&in_RDI[5].abortOnFailure = 0;
  this_00 = in_RDI + 8;
  std::__cxx11::string::string((string *)this_00);
  in_RDI[0x12].preserveTestFiles = false;
  in_RDI[0x13].printTestMessage = false;
  in_RDI[0x13].abortOnFailure = false;
  in_RDI[0x13].preserveTestFiles = false;
  in_RDI[0x14].printTestMessage = false;
  *(undefined8 *)&in_RDI[0x15].abortOnFailure = 0;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_RDI);
  uVar2 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)&in_RDI[0x1a].preserveTestFiles = uVar2;
  local_28 = 1;
  do {
    if (in_ESI <= local_28) {
      return;
    }
    if (local_28 < in_ESI + -1) {
      iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"-f");
      if (iVar1 != 0) {
        iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"--filter");
        if (iVar1 != 0) goto LAB_0010a93c;
      }
      lVar3 = (long)local_28;
      local_28 = local_28 + 1;
      std::__cxx11::string::operator=((string *)(in_RDI + 8),*(char **)(in_RDX + 8 + lVar3 * 8));
    }
LAB_0010a93c:
    if (local_28 < in_ESI + -1) {
      iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"-r");
      if (iVar1 != 0) {
        iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"--range");
        if (iVar1 != 0) goto LAB_0010a9b7;
      }
      local_28 = local_28 + 1;
      iVar1 = atoi(*(char **)(in_RDX + (long)local_28 * 8));
      *(long *)&in_RDI[0x15].abortOnFailure = (long)iVar1;
      in_RDI[0x12].preserveTestFiles = true;
    }
LAB_0010a9b7:
    iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"-p");
    if (iVar1 == 0) {
LAB_0010a9f5:
      in_RDI[0x13].printTestMessage = true;
    }
    else {
      iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"--preserve");
      if (iVar1 == 0) goto LAB_0010a9f5;
    }
    iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"--abort-on-failure");
    if (iVar1 == 0) {
      in_RDI[0x13].abortOnFailure = true;
    }
    iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"--suppress-msg");
    if (iVar1 == 0) {
      in_RDI[0x13].preserveTestFiles = true;
    }
    iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"--display-msg");
    if ((iVar1 == 0) && ((in_RDI[0x13].preserveTestFiles & 1U) == 0)) {
      in_RDI[0x14].printTestMessage = true;
    }
    iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"-h");
    if (iVar1 == 0) {
LAB_0010aabf:
      usage((int)((ulong)in_RDI >> 0x20),(char **)this_00);
      exit(0);
    }
    iVar1 = strcmp(*(char **)(in_RDX + (long)local_28 * 8),"--help");
    if (iVar1 == 0) goto LAB_0010aabf;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

TestSuite(int argc = 0, char **argv = nullptr)
        : cntPass(0)
        , cntFail(0)
        , useGivenRange(false)
        , preserveTestFiles(false)
        , forceAbortOnFailure(false)
        , suppressMsg(false)
        , displayMsg(false)
        , givenRange(0)
        , startTimeGlobal(std::chrono::system_clock::now())
    {
        for (int ii=1; ii<argc; ++ii) {
            // Filter.
            if ( ii < argc-1 &&
                 (!strcmp(argv[ii], "-f") ||
                  !strcmp(argv[ii], "--filter")) ) {
                filter = argv[++ii];
            }

            // Range.
            if ( ii < argc-1 &&
                 (!strcmp(argv[ii], "-r") ||
                  !strcmp(argv[ii], "--range")) ) {
                givenRange = atoi(argv[++ii]);
                useGivenRange = true;
            }

            // Do not clean up test files after test.
            if ( !strcmp(argv[ii], "-p") ||
                 !strcmp(argv[ii], "--preserve") ) {
                preserveTestFiles = true;
            }

            // Force abort on failure.
            if ( !strcmp(argv[ii], "--abort-on-failure") ) {
                forceAbortOnFailure = true;
            }

            // Suppress test messages.
            if ( !strcmp(argv[ii], "--suppress-msg") ) {
                suppressMsg = true;
            }

            // Display test messages.
            if ( !strcmp(argv[ii], "--display-msg") && !suppressMsg ) {
                displayMsg = true;
            }

            // Help
            if ( !strcmp(argv[ii], "-h") ||
                 !strcmp(argv[ii], "--help") ) {
                usage(argc, argv);
                exit(0);
            }
        }
    }